

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::GetLast(Cluster *this,BlockEntry **pLast)

{
  long lVar1;
  BlockEntry *pBVar2;
  char cVar3;
  long unaff_R15;
  long len;
  longlong pos;
  long lStack_38;
  longlong local_30;
  
  do {
    lVar1 = Parse(this,&local_30,&lStack_38);
    if (lVar1 < 0) {
      *pLast = (BlockEntry *)0x0;
      cVar3 = '\x01';
    }
    else {
      cVar3 = (lVar1 != 0) * '\x02';
      lVar1 = unaff_R15;
    }
    unaff_R15 = lVar1;
  } while (cVar3 == '\0');
  if (cVar3 != '\x01') {
    if (this->m_entries_count < 1) {
      pBVar2 = (BlockEntry *)0x0;
    }
    else {
      pBVar2 = this->m_entries[this->m_entries_count + -1];
    }
    *pLast = pBVar2;
    lVar1 = 0;
  }
  return lVar1;
}

Assistant:

long Cluster::GetLast(const BlockEntry*& pLast) const {
  for (;;) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pLast = NULL;
      return status;
    }

    if (status > 0)  // no new block
      break;
  }

  if (m_entries_count <= 0) {
    pLast = NULL;
    return 0;
  }

  assert(m_entries);

  const long idx = m_entries_count - 1;

  pLast = m_entries[idx];
  assert(pLast);

  return 0;
}